

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O2

int __thiscall
fasttext::Autotune::getCutoffForFileSize
          (Autotune *this,bool qout,bool qnorm,int dsub,int64_t fileSize)

{
  undefined1 auVar1 [16];
  int64_t iVar2;
  int64_t iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  element_type *local_48;
  int local_34;
  
  local_34 = dsub;
  FastText::getOutputMatrix((FastText *)&stack0xffffffffffffffb8);
  iVar2 = Matrix::size((Matrix *)local_48,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
  FastText::getOutputMatrix((FastText *)&stack0xffffffffffffffb8);
  iVar3 = Matrix::size((Matrix *)local_48,1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
  iVar6 = (int)iVar2;
  if (qout) {
    iVar5 = -0x25 - iVar6;
    if (!qnorm) {
      iVar5 = -0x25;
    }
    iVar6 = iVar5 + (int)iVar3 * -0x400 + (int)((iVar3 + 1) / -2) * iVar6;
  }
  else {
    iVar6 = iVar6 * (int)iVar3 * -4 + -0x10;
  }
  FastText::getInputMatrix((FastText *)&stack0xffffffffffffffb8);
  iVar2 = Matrix::size((Matrix *)local_48,1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
  lVar4 = ((ulong)(((int)fileSize + iVar6) - 0x6b) << 0x20) - (iVar2 << 0x2a);
  auVar1._8_8_ = lVar4 >> 0x3f;
  auVar1._0_8_ = lVar4 >> 0x20;
  iVar6 = SUB164(auVar1 / SEXT816((long)((local_34 + iVar2 + -1) / (long)local_34 + (ulong)qnorm +
                                        10)),0);
  if (iVar6 < 0x101) {
    iVar6 = 0x100;
  }
  return iVar6;
}

Assistant:

int Autotune::getCutoffForFileSize(
    bool qout,
    bool qnorm,
    int dsub,
    int64_t fileSize) const {
  int64_t outModelSize = 0;
  const int64_t outM = fastText_->getOutputMatrix()->size(0);
  const int64_t outN = fastText_->getOutputMatrix()->size(1);
  if (qout) {
    const int64_t outputPqSize = 16 + 4 * (outN * (1 << 8));
    outModelSize =
        21 + (outM * ((outN + 2 - 1) / 2)) + outputPqSize + (qnorm ? outM : 0);
  } else {
    outModelSize = 16 + 4 * (outM * outN);
  }
  const int64_t dim = fastText_->getInputMatrix()->size(1);

  int target = (fileSize - (107) - 4 * (1 << 8) * dim - outModelSize);
  int cutoff = target / ((dim + dsub - 1) / dsub + (qnorm ? 1 : 0) + 10);

  return std::max(cutoff, kCutoffLimit);
}